

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

ByteArray *
ByteArray::fromFile(ByteArray *__return_storage_ptr__,path *fileName,long start,size_t size)

{
  byte bVar1;
  _Ios_Openmode mode;
  byte *pbVar2;
  size_t sVar3;
  fpos<__mbstate_t> local_258;
  uintmax_t local_248;
  uintmax_t fileSize;
  undefined1 local_230 [8];
  ifstream stream;
  size_t size_local;
  long start_local;
  path *fileName_local;
  ByteArray *ret;
  
  stream.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ = size;
  mode = std::operator|(_S_in,_S_bin);
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_230,fileName,mode);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    ByteArray(__return_storage_ptr__);
  }
  else {
    local_248 = ghc::filesystem::file_size(fileName);
    if ((ulong)start < local_248) {
      if ((stream.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ == 0) ||
         (local_248 <
          (ulong)(start + stream.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_))) {
        stream.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_ = local_248 - start;
      }
      std::fpos<__mbstate_t>::fpos(&local_258,start);
      std::istream::seekg(local_230,local_258._M_off,local_258._M_state);
      ByteArray(__return_storage_ptr__);
      grow(__return_storage_ptr__,stream.super_basic_ifstream<char,_std::char_traits<char>_>._512_8_
          );
      pbVar2 = data(__return_storage_ptr__,0);
      std::istream::read(local_230,(long)pbVar2);
      sVar3 = std::istream::gcount();
      __return_storage_ptr__->size_ = sVar3;
    }
    else {
      ByteArray(__return_storage_ptr__);
    }
  }
  fileSize._0_4_ = 1;
  ghc::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream
            ((basic_ifstream<char,_std::char_traits<char>_> *)local_230);
  return __return_storage_ptr__;
}

Assistant:

ByteArray ByteArray::fromFile(const fs::path& fileName, long start, size_t size)
{
	fs::ifstream stream(fileName, fs::fstream::in | fs::fstream::binary);
	if (!stream.is_open())
		return {};

	auto fileSize = fs::file_size(fileName);
	if (start >= fileSize)
		return {};

	if (size == 0 || start+(long)size > fileSize)
		size = fileSize-start;

	stream.seekg(start);

	ByteArray ret;
	ret.grow(size);

	stream.read(reinterpret_cast<char *>(ret.data()), size);
	ret.size_ = stream.gcount();

	return ret;
}